

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

void bddFixTree(DdManager *table,MtrNode *treenode)

{
  MtrNode *pMVar1;
  uint uVar2;
  
  if (treenode != (MtrNode *)0x0) {
    uVar2 = treenode->index;
    if ((int)uVar2 < table->size) {
      uVar2 = table->perm[uVar2];
    }
    treenode->low = uVar2;
    if (treenode->child != (MtrNode *)0x0) {
      bddFixTree(table,treenode->child);
    }
    if (treenode->younger != (MtrNode *)0x0) {
      bddFixTree(table,treenode->younger);
    }
    pMVar1 = treenode->parent;
    if ((pMVar1 != (MtrNode *)0x0) && (treenode->low < pMVar1->low)) {
      pMVar1->low = treenode->low;
      pMVar1->index = treenode->index;
    }
  }
  return;
}

Assistant:

static void
bddFixTree(
  DdManager * table,
  MtrNode * treenode)
{
    if (treenode == NULL) return;
    treenode->low = ((int) treenode->index < table->size) ?
        table->perm[treenode->index] : treenode->index;
    if (treenode->child != NULL) {
        bddFixTree(table, treenode->child);
    }
    if (treenode->younger != NULL)
        bddFixTree(table, treenode->younger);
    if (treenode->parent != NULL && treenode->low < treenode->parent->low) {
        treenode->parent->low = treenode->low;
        treenode->parent->index = treenode->index;
    }
    return;

}